

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O1

void __thiscall
GrcManager::OutputSileTable
          (GrcManager *this,GrcBinaryStream *pbstrm,utf16 *pchSrcFontFamily,char *pchSrcFileName,
          uint luMasterChecksum,uint *pnCreateTime,uint *pnModifyTime,int *pibOffset,int *pcbSize)

{
  undefined1 *puVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  offset_t ibOffset;
  ulong uVar9;
  uint8_t be [2];
  uint local_44;
  char *local_40;
  GrcBinaryStream *local_38;
  
  puVar1 = &(pbstrm->super_fstream).field_0x10;
  local_40 = pchSrcFileName;
  local_38 = pbstrm;
  iVar5 = std::ostream::tellp();
  *pibOffset = iVar5;
  local_44 = 0x100;
  std::ostream::write(puVar1,(long)&local_44);
  local_44 = luMasterChecksum >> 0x18 | (luMasterChecksum & 0xff0000) >> 8 |
             (luMasterChecksum & 0xff00) << 8 | luMasterChecksum << 0x18;
  std::ostream::write(puVar1,(long)&local_44);
  uVar2 = *pnCreateTime;
  local_44 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  std::ostream::write(puVar1,(long)&local_44);
  uVar2 = pnCreateTime[1];
  local_44 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  std::ostream::write(puVar1,(long)&local_44);
  uVar2 = *pnModifyTime;
  local_44 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  std::ostream::write(puVar1,(long)&local_44);
  uVar2 = pnModifyTime[1];
  local_44 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  std::ostream::write(puVar1,(long)&local_44);
  sVar6 = gr::utf16len(pchSrcFontFamily);
  local_44 = CONCAT22(local_44._2_2_,(ushort)sVar6 << 8 | (ushort)sVar6 >> 8);
  std::ostream::write(puVar1,(long)&local_44);
  if (sVar6 != 0) {
    uVar7 = 0;
    uVar9 = 1;
    do {
      local_44 = CONCAT22(local_44._2_2_,pchSrcFontFamily[uVar7] << 8 | pchSrcFontFamily[uVar7] >> 8
                         );
      std::ostream::write(puVar1,(long)&local_44);
      bVar3 = uVar9 < sVar6;
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar3);
  }
  local_44 = local_44 & 0xffffff00;
  std::ostream::write(puVar1,(long)&local_44);
  pcVar4 = local_40;
  sVar8 = strlen(local_40);
  local_44 = CONCAT22(local_44._2_2_,(ushort)sVar8 << 8 | (ushort)sVar8 >> 8);
  std::ostream::write(puVar1,(long)&local_44);
  std::ostream::write(puVar1,(long)pcVar4);
  local_44 = local_44 & 0xffffff00;
  std::ostream::write(puVar1,(long)&local_44);
  ibOffset = std::ostream::tellp();
  *pcbSize = (int)ibOffset - *pibOffset;
  GrcBinaryStream::SeekPadLong(local_38,ibOffset);
  return;
}

Assistant:

void GrcManager::OutputSileTable(GrcBinaryStream * pbstrm,
	 utf16 * pchSrcFontFamily, char * pchSrcFileName, unsigned int luMasterChecksum,
	 unsigned int * pnCreateTime, unsigned int * pnModifyTime,
	 int * pibOffset, int * pcbSize)
{
	*pibOffset = int(pbstrm->Position());

	// version
	int fxd = VersionForTable(ktiSile);
	pbstrm->WriteInt(fxd);

	// master check sum from source font
	pbstrm->WriteInt(luMasterChecksum);

	// create and modify times of source font
	pbstrm->WriteInt(pnCreateTime[0]);
	pbstrm->WriteInt(pnCreateTime[1]);
	pbstrm->WriteInt(pnModifyTime[0]);
	pbstrm->WriteInt(pnModifyTime[1]);

	// source font family name
	auto cchFontFamily = utf16len(pchSrcFontFamily);
	pbstrm->WriteShort(cchFontFamily);
	for (auto ich = 0U; ich < cchFontFamily; ++ich)
		pbstrm->WriteShort(pchSrcFontFamily[ich]);
	pbstrm->WriteByte(0);

	// source font file
	auto cchFile = strlen(pchSrcFileName);
	pbstrm->WriteShort(cchFile);
	pbstrm->Write(pchSrcFileName, cchFile);
	pbstrm->WriteByte(0);

	// handle size and padding
	auto lPos = pbstrm->Position();
	*pcbSize = int(lPos - *pibOffset);
	pbstrm->SeekPadLong(lPos);
}